

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void enqueue(debug_level level,string *tag,string *string)

{
  log_queue *this;
  log_entry *this_00;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_38;
  
  local_38._M_device = &mutex;
  local_38._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  this = queue;
  local_38._M_owns = true;
  if (queue != (log_queue *)0x0) {
    this_00 = (log_entry *)operator_new(0x48);
    log_queue::log_entry::log_entry(this_00,level,tag,string);
    log_queue::push(this,this_00);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

static void enqueue(debug_level level, const std::string& tag, const std::string& string) {
    std::unique_lock<std::recursive_mutex> lock(mutex);

    if (queue) {
        queue->push(new log_queue::log_entry(level, tag, string));
    }
}